

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetTxInIssuanceInfoByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  ByteData *pBVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int64_t iVar4;
  pointer puVar5;
  CfdException *pCVar6;
  ulong uVar7;
  size_t sVar8;
  Amount AVar9;
  char *work_token_rangeproof;
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference ref;
  bool local_259;
  undefined1 local_258 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  ByteData local_208;
  ConfidentialValue local_1e8;
  void *local_1c0;
  ConfidentialValue local_1b8;
  ConfidentialTxInReference local_190;
  
  local_210 = (char *)0x0;
  local_218 = (char *)0x0;
  local_220 = (char *)0x0;
  local_228 = (char *)0x0;
  local_230 = (char *)0x0;
  local_238 = (char *)0x0;
  local_1c0 = handle;
  cfd::Initialize();
  pBVar1 = &local_190.super_AbstractTxInReference.txid_.data_;
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_190);
  if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  local_259 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_259);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) != (ConfidentialTransaction *)0x0)
  {
    if (local_259 == true) {
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_190);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ConfidentialTransaction::GetTxIn
              (&local_190,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (entropy != (char **)0x0) {
      local_258 = (undefined1  [8])0x0;
      paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_248._M_allocated_capacity = 0;
      uVar7 = (long)local_190.asset_entropy_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.asset_entropy_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 == 0) {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          std::__throw_bad_alloc();
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(uVar7);
      }
      local_248._M_allocated_capacity = (size_type)(paVar3->_M_local_buf + uVar7);
      sVar8 = (long)local_190.asset_entropy_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.asset_entropy_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_258 = (undefined1  [8])paVar3;
      if (sVar8 != 0) {
        paStack_250 = paVar3;
        memmove(paVar3,local_190.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar8);
      }
      paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar3->_M_local_buf + sVar8);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1e8,(ByteData256 *)local_258);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_1b8,(BlindFactor *)&local_1e8);
      local_210 = cfd::capi::CreateString((string *)&local_1b8);
      if (local_1b8._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_1b8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1b8._vptr_ConfidentialValue);
      }
      local_1e8._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258);
      }
    }
    if (nonce != (char **)0x0) {
      local_258 = (undefined1  [8])0x0;
      paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_248._M_allocated_capacity = 0;
      uVar7 = (long)local_190.blinding_nonce_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.blinding_nonce_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 == 0) {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          std::__throw_bad_alloc();
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(uVar7);
      }
      local_248._M_allocated_capacity = (size_type)(paVar3->_M_local_buf + uVar7);
      sVar8 = (long)local_190.blinding_nonce_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.blinding_nonce_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_258 = (undefined1  [8])paVar3;
      if (sVar8 != 0) {
        paStack_250 = paVar3;
        memmove(paVar3,local_190.blinding_nonce_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar8);
      }
      paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar3->_M_local_buf + sVar8);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1e8,(ByteData256 *)local_258);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_1b8,(BlindFactor *)&local_1e8);
      local_218 = cfd::capi::CreateString((string *)&local_1b8);
      if (local_1b8._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_1b8.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1b8._vptr_ConfidentialValue);
      }
      local_1e8._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258);
      }
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_1b8,&local_190.issuance_amount_);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_1e8,&local_190.inflation_keys_);
    if (asset_amount != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1b8);
      if (!bVar2) {
        bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1b8);
        if (bVar2) {
          iVar4 = 0;
        }
        else {
          AVar9 = cfd::core::ConfidentialValue::GetAmount(&local_1b8);
          local_258 = (undefined1  [8])AVar9.amount_;
          paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(paStack_250._1_7_,AVar9.ignore_check_);
          iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_258);
        }
        *asset_amount = iVar4;
      }
    }
    if (asset_value != (char **)0x0) {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_258,&local_1b8);
      local_220 = cfd::capi::CreateString((string *)local_258);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258);
      }
    }
    if (token_amount != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1e8);
      if (!bVar2) {
        bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1e8);
        if (bVar2) {
          iVar4 = 0;
        }
        else {
          AVar9 = cfd::core::ConfidentialValue::GetAmount(&local_1e8);
          local_258 = (undefined1  [8])AVar9.amount_;
          paStack_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(paStack_250._1_7_,AVar9.ignore_check_);
          iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_258);
        }
        *token_amount = iVar4;
      }
    }
    if (token_value != (char **)0x0) {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_258,&local_1e8);
      local_228 = cfd::capi::CreateString((string *)local_258);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258);
      }
    }
    if (asset_rangeproof != (char **)0x0) {
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar7 = (long)local_190.issuance_amount_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.issuance_amount_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 == 0) {
        puVar5 = (pointer)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          std::__throw_bad_alloc();
        }
        puVar5 = (pointer)operator_new(uVar7);
      }
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar5 + uVar7;
      sVar8 = (long)local_190.issuance_amount_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.issuance_amount_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar5;
      if (sVar8 != 0) {
        local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        memmove(puVar5,local_190.issuance_amount_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar8);
      }
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5 + sVar8;
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_258,&local_208);
      local_230 = cfd::capi::CreateString((string *)local_258);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258);
      }
      if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (token_rangeproof != (char **)0x0) {
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar7 = (long)local_190.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 == 0) {
        puVar5 = (pointer)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          std::__throw_bad_alloc();
        }
        puVar5 = (pointer)operator_new(uVar7);
      }
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar5 + uVar7;
      sVar8 = (long)local_190.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_190.inflation_keys_rangeproof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar5;
      if (sVar8 != 0) {
        local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        memmove(puVar5,local_190.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar8);
      }
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5 + sVar8;
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_258,&local_208);
      local_238 = cfd::capi::CreateString((string *)local_258);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258);
      }
      if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_210 != (char *)0x0) {
      *entropy = local_210;
    }
    if (local_218 != (char *)0x0) {
      *nonce = local_218;
    }
    if (local_220 != (char *)0x0) {
      *asset_value = local_220;
    }
    if (local_228 != (char *)0x0) {
      *token_value = local_228;
    }
    if (local_230 != (char *)0x0) {
      *asset_rangeproof = local_230;
    }
    if (local_238 != (char *)0x0) {
      *token_rangeproof = local_238;
    }
    local_1e8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1b8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_1b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
    return 0;
  }
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_190);
  __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIssuanceInfoByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxInReference ref = tx->GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}